

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtconcurrentthreadengine.cpp
# Opt level: O2

void __thiscall QtConcurrent::ThreadEngineBase::acquireBarrierSemaphore(ThreadEngineBase *this)

{
  ThreadEngineBarrier::acquire(&this->barrier);
  return;
}

Assistant:

void ThreadEngineBase::acquireBarrierSemaphore()
{
    barrier.acquire();
}